

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::basic_mustache(basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *this,string_type *input)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  parser;
  context<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ctx;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  context;
  parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_b1;
  basic_context<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_b0;
  void *local_a8;
  undefined8 uStack_a0;
  long local_98;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_90;
  
  (this->error_message_)._M_dataplus._M_p = (pointer)&(this->error_message_).field_2;
  (this->error_message_)._M_string_length = 0;
  (this->error_message_).field_2._M_local_buf[0] = L'\0';
  (this->root_component_).text._M_dataplus._M_p = (pointer)&(this->root_component_).text.field_2;
  (this->root_component_).text._M_string_length = 0;
  (this->root_component_).text.field_2._M_local_buf[0] = L'\0';
  (this->root_component_).tag.name._M_dataplus._M_p =
       (pointer)&(this->root_component_).tag.name.field_2;
  (this->root_component_).tag.name._M_string_length = 0;
  (this->root_component_).tag.name.field_2._M_local_buf[0] = L'\0';
  (this->root_component_).tag.type = text;
  (this->root_component_).tag.section_text.
  super___shared_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->root_component_).tag.section_text.
  super___shared_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->root_component_).tag.delim_set.
  super___shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->root_component_).tag.delim_set.
  super___shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->root_component_).children.
  super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->root_component_).children.
  super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->root_component_).children.
  super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->root_component_).position = 0xffffffffffffffff;
  *(undefined8 *)((long)&(this->escape_).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->escape_).super__Function_base._M_functor = html_escape<std::__cxx11::wstring>;
  (this->escape_)._M_invoker =
       Catch::clara::std::
       _Function_handler<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&),_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(*)(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
       ::_M_invoke;
  (this->escape_).super__Function_base._M_manager =
       Catch::clara::std::
       _Function_handler<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&),_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(*)(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
       ::_M_manager;
  local_90.ctx = &local_b0;
  local_b0._vptr_basic_context = (_func_int **)&PTR__context_00242578;
  local_a8 = (void *)0x0;
  uStack_a0 = 0;
  local_98 = 0;
  delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::delimiter_set(&local_90.delim_set);
  paVar1 = &local_90.line_buffer.data.field_2;
  local_90.line_buffer.data._M_string_length = 0;
  local_90.line_buffer.data.field_2._M_local_buf[0] = L'\0';
  local_90.line_buffer.contained_section_tag = false;
  local_90.line_buffer.data._M_dataplus._M_p = (pointer)paVar1;
  parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::parse(&local_b1,input,&local_90,&this->root_component_,&this->error_message_);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_90.line_buffer.data._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.line_buffer.data._M_dataplus._M_p,
                    CONCAT44(local_90.line_buffer.data.field_2._M_local_buf[1],
                             local_90.line_buffer.data.field_2._M_local_buf[0]) * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_90.delim_set.end._M_dataplus._M_p != &local_90.delim_set.end.field_2) {
    operator_delete(local_90.delim_set.end._M_dataplus._M_p,
                    local_90.delim_set.end.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_90.delim_set.begin._M_dataplus._M_p != &local_90.delim_set.begin.field_2) {
    operator_delete(local_90.delim_set.begin._M_dataplus._M_p,
                    local_90.delim_set.begin.field_2._M_allocated_capacity * 4 + 4);
  }
  local_b0._vptr_basic_context = (_func_int **)&PTR__context_00242578;
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  return;
}

Assistant:

basic_mustache(const string_type& input)
        : basic_mustache() {
        context<string_type> ctx;
        context_internal<string_type> context{ctx};
        parser<string_type> parser{input, context, root_component_, error_message_};
    }